

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_expression.cpp
# Opt level: O3

bool __thiscall duckdb::ParsedExpression::IsScalar(ParsedExpression *this)

{
  bool is_scalar;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_29;
  local_29 = 1;
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/parsed_expression.cpp:29:53)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/parsed_expression.cpp:29:53)>
             ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (this,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (bool)local_29;
}

Assistant:

bool ParsedExpression::IsScalar() const {
	bool is_scalar = true;
	ParsedExpressionIterator::EnumerateChildren(*this, [&](const ParsedExpression &child) {
		if (!child.IsScalar()) {
			is_scalar = false;
		}
	});
	return is_scalar;
}